

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptron.cpp
# Opt level: O0

void __thiscall Perceptron::createFeatureGt(Perceptron *this)

{
  bool bVar1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar2;
  reference pdVar3;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_e0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_d8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_d0;
  double *local_c8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_c0;
  undefined1 local_b8 [8];
  vector<double,_std::allocator<double>_> testf;
  vector<double,_std::allocator<double>_> *data_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1_1;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_78 [3];
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  double *local_58;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> trainf;
  vector<double,_std::allocator<double>_> *data;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  Perceptron *this_local;
  
  pvVar2 = &(this->super_Base).trainData;
  __end1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(pvVar2);
  data = (vector<double,_std::allocator<double>_> *)
         std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                *)&data);
    if (!bVar1) break;
    trainf.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator*(&__end1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_48);
    local_50._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)
                    trainf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    local_60._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)
                    trainf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    local_58 = (double *)
               __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator-(&local_60,1);
    std::vector<double,std::allocator<double>>::
    assign<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
              ((vector<double,std::allocator<double>> *)local_48,local_50,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_58);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&(this->super_Base).trainDataF,(value_type *)local_48);
    __range1_1 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)std::vector<double,_std::allocator<double>_>::end
                              ((vector<double,_std::allocator<double>_> *)
                               trainf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
    local_78[0] = __gnu_cxx::
                  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
                  operator-((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)&__range1_1,1);
    pdVar3 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_78);
    std::vector<double,_std::allocator<double>_>::push_back(&(this->super_Base).trainDataGT,pdVar3);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_48);
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1);
  }
  pvVar2 = &(this->super_Base).testData;
  __end1_1 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::begin(pvVar2);
  data_1 = (vector<double,_std::allocator<double>_> *)
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                        *)&data_1);
    if (!bVar1) break;
    testf.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                  ::operator*(&__end1_1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_b8);
    local_c0._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)
                    testf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    local_d0._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)
                    testf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    local_c8 = (double *)
               __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator-(&local_d0,1);
    std::vector<double,std::allocator<double>>::
    assign<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
              ((vector<double,std::allocator<double>> *)local_b8,local_c0,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               local_c8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back(&(this->super_Base).testDataF,(value_type *)local_b8);
    local_e0._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)
                    testf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    local_d8 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator-(&local_e0,1);
    pdVar3 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_d8);
    std::vector<double,_std::allocator<double>_>::push_back(&(this->super_Base).testDataGT,pdVar3);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_b8);
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void Perceptron::createFeatureGt() {
    //create feature for test,using trainData, testData
    for (const auto& data:trainData){
        std::vector<double> trainf;
        trainf.assign(data.begin(), data.end()-1);
        trainDataF.push_back(trainf);
        trainDataGT.push_back(*(data.end()-1));
    }
    for (const auto& data:testData){
        std::vector<double> testf;
        testf.assign(data.begin(), data.end()-1);
        testDataF.push_back(testf);
        testDataGT.push_back(*(data.end()-1));
    }
}